

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatconfig.c
# Opt level: O1

int ec_findconfig(uint32 man,uint32 id)

{
  int iVar1;
  long lVar2;
  uint32 uVar3;
  
  uVar3 = 2;
  iVar1 = 1;
  lVar2 = 0x90;
  while ((uVar3 != man || (*(uint32 *)(lVar2 + 0x10efbc) != id))) {
    uVar3 = *(uint32 *)(ec_configlist[0].name + lVar2 + -8);
    iVar1 = iVar1 + 1;
    lVar2 = lVar2 + 0x48;
    if (lVar2 == 0x6c0) {
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int ec_findconfig( uint32 man, uint32 id)
{
   int i = 0;

   do 
   {
      i++;
   } while ( (ec_configlist[i].man != EC_CONFIGEND) && 
           ((ec_configlist[i].man != man) || (ec_configlist[i].id != id)) );
   if (ec_configlist[i].man == EC_CONFIGEND)
   {
      i = 0;
   }
   return i;
}